

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O1

void Curl_resolver_kill(connectdata *conn)

{
  undefined1 *puVar1;
  pthread_t **hnd;
  
  hnd = (pthread_t **)(conn->async).os_specific;
  if ((hnd != (pthread_t **)0x0) && (*hnd != (pthread_t *)0x0)) {
    Curl_thread_join(hnd);
    puVar1 = &(conn->async).field_0x28;
    *puVar1 = *puVar1 | 1;
  }
  destroy_async_data(&conn->async);
  return;
}

Assistant:

void Curl_resolver_kill(struct connectdata *conn)
{
  struct thread_data *td = (struct thread_data*) conn->async.os_specific;

  /* If we're still resolving, we must wait for the threads to fully clean up,
     unfortunately.  Otherwise, we can simply cancel to clean up any resolver
     data. */
  if(td && td->thread_hnd != curl_thread_t_null)
    (void)thread_wait_resolv(conn, NULL, FALSE);
  else
    Curl_resolver_cancel(conn);
}